

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void PSG_init(PSG_conflict *psg,UINT32 c,UINT32 r)

{
  UINT32 local_1c;
  UINT32 r_local;
  UINT32 c_local;
  PSG_conflict *psg_local;
  
  memset(psg,0,0x108);
  PSG_setVolumeMode(psg,1);
  psg->clk = c;
  local_1c = r;
  if (r == 0) {
    local_1c = 0xac44;
  }
  psg->rate = local_1c;
  PSG_set_quality(psg,0);
  psg->stereo_mask[0] = 3;
  psg->stereo_mask[1] = 3;
  psg->stereo_mask[2] = 3;
  return;
}

Assistant:

EMU2149_API void
PSG_init (PSG * psg, UINT32 c, UINT32 r)
{
  memset(psg, 0x00, sizeof(PSG));

  PSG_setVolumeMode (psg, EMU2149_VOL_DEFAULT);
  psg->clk = c;
  psg->rate = r ? r : 44100;
  PSG_set_quality (psg, 0);
  psg->stereo_mask[0] = 0x03;
  psg->stereo_mask[1] = 0x03;
  psg->stereo_mask[2] = 0x03;
}